

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_match_time.c
# Opt level: O0

void test_newer_time(void)

{
  wchar_t wVar1;
  archive *_a;
  archive_entry *entry;
  archive *m;
  archive_entry *ae;
  
  _a = archive_match_new();
  wVar1 = assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_time.c"
                           ,L'%',(uint)(_a != (archive *)0x0),"(m = archive_match_new()) != NULL",
                           (void *)0x0);
  if (wVar1 != L'\0') {
    entry = archive_entry_new();
    wVar1 = assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_time.c"
                             ,L'\'',(uint)(entry != (archive_entry *)0x0),
                             "(ae = archive_entry_new()) != NULL",(void *)0x0);
    if (wVar1 == L'\0') {
      archive_match_free(_a);
    }
    else {
      wVar1 = archive_match_include_time(_a,L'́',0x1ec8,0);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_time.c"
                          ,L'.',0,"0",(long)wVar1,
                          "archive_match_include_time(m, ARCHIVE_MATCH_MTIME | ARCHIVE_MATCH_CTIME | ARCHIVE_MATCH_NEWER, 7880, 0)"
                          ,_a);
      archive_entry_copy_pathname(entry,"file1");
      archive_entry_set_mtime(entry,0x1ec8,0);
      archive_entry_set_ctime(entry,0x1ec8,0);
      failure("Both Its mtime and ctime should be excluded");
      wVar1 = archive_match_time_excluded(_a,entry);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_time.c"
                          ,L'4',1,"1",(long)wVar1,"archive_match_time_excluded(m, ae)",(void *)0x0);
      wVar1 = archive_match_excluded(_a,entry);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_time.c"
                          ,L'5',1,"1",(long)wVar1,"archive_match_excluded(m, ae)",(void *)0x0);
      archive_entry_set_mtime(entry,0x1ec7,999);
      archive_entry_set_ctime(entry,0x1ec7,999);
      failure("Both Its mtime and ctime should be excluded");
      wVar1 = archive_match_time_excluded(_a,entry);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_time.c"
                          ,L'9',1,"1",(long)wVar1,"archive_match_time_excluded(m, ae)",(void *)0x0);
      wVar1 = archive_match_excluded(_a,entry);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_time.c"
                          ,L':',1,"1",(long)wVar1,"archive_match_excluded(m, ae)",(void *)0x0);
      archive_entry_set_mtime(entry,0x1ec9,0);
      archive_entry_set_ctime(entry,0x1ec9,0);
      failure("Both Its mtime and ctime should not be excluded");
      wVar1 = archive_match_time_excluded(_a,entry);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_time.c"
                          ,L'?',0,"0",(long)wVar1,"archive_match_time_excluded(m, ae)",(void *)0x0);
      wVar1 = archive_match_excluded(_a,entry);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_time.c"
                          ,L'@',0,"0",(long)wVar1,"archive_match_excluded(m, ae)",(void *)0x0);
      archive_entry_set_mtime(entry,0x1ec8,1);
      archive_entry_set_ctime(entry,0x1ec8,0);
      failure("Its mtime should be excluded");
      wVar1 = archive_match_time_excluded(_a,entry);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_time.c"
                          ,L'E',1,"1",(long)wVar1,"archive_match_time_excluded(m, ae)",(void *)0x0);
      wVar1 = archive_match_excluded(_a,entry);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_time.c"
                          ,L'F',1,"1",(long)wVar1,"archive_match_excluded(m, ae)",(void *)0x0);
      archive_entry_set_mtime(entry,0x1ec8,0);
      archive_entry_set_ctime(entry,0x1ec8,1);
      failure("Its ctime should be excluded");
      wVar1 = archive_match_time_excluded(_a,entry);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_time.c"
                          ,L'K',1,"1",(long)wVar1,"archive_match_time_excluded(m, ae)",(void *)0x0);
      wVar1 = archive_match_excluded(_a,entry);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_time.c"
                          ,L'L',1,"1",(long)wVar1,"archive_match_excluded(m, ae)",(void *)0x0);
      archive_entry_free(entry);
      archive_match_free(_a);
    }
  }
  return;
}

Assistant:

static void
test_newer_time(void)
{
	struct archive_entry *ae;
	struct archive *m;

	if (!assert((m = archive_match_new()) != NULL))
		return;
	if (!assert((ae = archive_entry_new()) != NULL)) {
		archive_match_free(m);
		return;
	}

	assertEqualIntA(m, 0, archive_match_include_time(m,
	    ARCHIVE_MATCH_MTIME | ARCHIVE_MATCH_CTIME |
	    ARCHIVE_MATCH_NEWER, 7880, 0));

	archive_entry_copy_pathname(ae, "file1");
	archive_entry_set_mtime(ae, 7880, 0);
	archive_entry_set_ctime(ae, 7880, 0);
	failure("Both Its mtime and ctime should be excluded");
	assertEqualInt(1, archive_match_time_excluded(m, ae));
	assertEqualInt(1, archive_match_excluded(m, ae));
	archive_entry_set_mtime(ae, 7879, 999);
	archive_entry_set_ctime(ae, 7879, 999);
	failure("Both Its mtime and ctime should be excluded");
	assertEqualInt(1, archive_match_time_excluded(m, ae));
	assertEqualInt(1, archive_match_excluded(m, ae));

	archive_entry_set_mtime(ae, 7881, 0);
	archive_entry_set_ctime(ae, 7881, 0);
	failure("Both Its mtime and ctime should not be excluded");
	assertEqualInt(0, archive_match_time_excluded(m, ae));
	assertEqualInt(0, archive_match_excluded(m, ae));

	archive_entry_set_mtime(ae, 7880, 1);
	archive_entry_set_ctime(ae, 7880, 0);
	failure("Its mtime should be excluded");
	assertEqualInt(1, archive_match_time_excluded(m, ae));
	assertEqualInt(1, archive_match_excluded(m, ae));

	archive_entry_set_mtime(ae, 7880, 0);
	archive_entry_set_ctime(ae, 7880, 1);
	failure("Its ctime should be excluded");
	assertEqualInt(1, archive_match_time_excluded(m, ae));
	assertEqualInt(1, archive_match_excluded(m, ae));

	/* Clean up. */
	archive_entry_free(ae);
	archive_match_free(m);
}